

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O2

void __thiscall L18_1::Useless::Useless(Useless *this,int k,char ch)

{
  int i;
  
  this->n = k;
  count = count + 1;
  std::operator<<((ostream *)&std::cout,"int and char constructor called, number of instance: ");
}

Assistant:

Useless::Useless(int k, char ch): n(k) {
        count++;
        cout << "int and char constructor called, number of instance: " << count << endl;

        //  allocate array of char, and fill with ch
        pc = new char[n];
        for(int i = 0; i < n; i++) {
            pc[i] = ch;
        }
        showObject();
    }